

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined8 in_RAX;
  long *plVar1;
  int iVar2;
  undefined8 local_38;
  int a;
  int b;
  
  local_38._4_4_ = (uint)((ulong)in_RAX >> 0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_8b5,0x1d);
  local_38 = (ulong)local_38._4_4_ << 0x20;
  std::istream::operator>>((istream *)&std::cin,(int *)&local_38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_8d8,0x2c);
  local_38 = local_38 & 0xffffffff;
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&local_38 + 4));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_8ee,0x25);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_38._4_4_ + (int)local_38);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_904,0x27);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)local_38 - local_38._4_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_91a,0x23);
  plVar1 = (long *)std::ostream::operator<<
                             ((ostream *)&std::cout,(int)local_38 / (int)local_38._4_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_930,0x24);
  plVar1 = (long *)std::ostream::operator<<
                             ((ostream *)&std::cout,(int)local_38 % (int)local_38._4_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_946,0x27);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_38._4_4_ * (int)local_38);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_950,0x40);
  iVar2 = (int)local_38 + 1;
  local_38._0_4_ = iVar2;
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_966,0x59);
  iVar2 = (int)local_38;
  local_38._0_4_ = (int)local_38 + 1;
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_97c,0x40);
  local_38._4_4_ = local_38._4_4_ + -1;
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_38._4_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_986,0x59);
  iVar2 = local_38._4_4_;
  local_38 = CONCAT44(local_38._4_4_ + -1,(int)local_38);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
    cout << "Введите число A: ";
    int a = 0; // Объявление и инициализация переменной
    cin >> a; // Мы загружаем данные в переменную a
    cout << "Введите число B (кроме 0): ";
    int b = 0; // Объявление и инициализация переменной b
    cin >> b; // Мы загружаем данные в переменную Ь
    cout << "Результат сложения  " << a + b << endl; // Сложение
    cout << "Результат вычитания: " << a - b << endl; // Вычитание
    cout << "Результат деления: " << a / b << endl; // Деление
    cout << "Остаток от деления: " << a % b << endl; // Остаток от деления
    cout << "Результат умножения: " << a * b << endl; // Умножение
    cout << "Инкремент префиксный переменной a: " << ++a << endl; // Инкремент префиксный
    cout << "Инкремент суффиксный (постфиксный) переменной a: " << a++ << endl; // Инкремент суффиксный (постфиксный)
    cout << "Декремент префиксный переменной b: " << --b << endl; // Декремент префиксный
    cout << "Декремент суффиксный (постфиксный) переменной b: " << b-- << endl; // Декремент суффиксный (постфиксный)

    return 0;
}